

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

int GIFNextPixel(gdImagePtr im,GifCtx *ctx)

{
  int iVar1;
  int iVar2;
  
  if (ctx->CountDown == 0) {
    return -1;
  }
  ctx->CountDown = ctx->CountDown + -1;
  iVar1 = gdImageGetPixel(im,ctx->curx,ctx->cury);
  iVar2 = ctx->curx + 1;
  ctx->curx = iVar2;
  if (iVar2 != ctx->Width) {
    return iVar1;
  }
  ctx->curx = 0;
  if (ctx->Interlace == 0) {
    iVar2 = ctx->cury + 1;
  }
  else {
    switch(ctx->Pass) {
    case 0:
      iVar2 = ctx->cury + 8;
      ctx->cury = iVar2;
      if (iVar2 < ctx->Height) {
        return iVar1;
      }
      ctx->Pass = 1;
      iVar2 = 4;
      break;
    case 1:
      iVar2 = ctx->cury + 8;
      ctx->cury = iVar2;
      if (iVar2 < ctx->Height) {
        return iVar1;
      }
      ctx->Pass = 2;
      iVar2 = 2;
      break;
    case 2:
      iVar2 = ctx->cury + 4;
      ctx->cury = iVar2;
      if (iVar2 < ctx->Height) {
        return iVar1;
      }
      ctx->Pass = 3;
      iVar2 = 1;
      break;
    case 3:
      iVar2 = ctx->cury + 2;
      break;
    default:
      goto switchD_00118a99_default;
    }
  }
  ctx->cury = iVar2;
switchD_00118a99_default:
  return iVar1;
}

Assistant:

static int GIFNextPixel(gdImagePtr im, GifCtx *ctx)
{
	int r;

	if(ctx->CountDown == 0) {
		return EOF;
	}

	--(ctx->CountDown);

	r = gdImageGetPixel(im, ctx->curx, ctx->cury);

	BumpPixel(ctx);

	return r;
}